

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

size_t strlen_url(char *url)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  
  bVar2 = true;
  sVar3 = 0;
  do {
    cVar1 = *url;
    if (cVar1 == ' ') {
      if (bVar2) {
        sVar3 = sVar3 + 3;
        bVar2 = true;
      }
      else {
        sVar3 = sVar3 + 1;
        bVar2 = false;
      }
    }
    else {
      if (cVar1 == '?') {
        bVar2 = false;
      }
      else if (cVar1 == '\0') {
        return sVar3;
      }
      sVar4 = sVar3 + 2;
      if (-1 < cVar1) {
        sVar4 = sVar3;
      }
      sVar3 = sVar4 + 1;
    }
    url = url + 1;
  } while( true );
}

Assistant:

static size_t strlen_url(const char *url)
{
  const unsigned char *ptr;
  size_t newlen=0;
  bool left=TRUE; /* left side of the ? */

  for(ptr=(unsigned char *)url; *ptr; ptr++) {
    switch(*ptr) {
    case '?':
      left=FALSE;
      /* fall through */
    default:
      if(*ptr >= 0x80)
        newlen += 2;
      newlen++;
      break;
    case ' ':
      if(left)
        newlen+=3;
      else
        newlen++;
      break;
    }
  }
  return newlen;
}